

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.h
# Opt level: O1

int __thiscall
CLI::Option::_add_result
          (Option *this,string *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *res)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var;
  undefined8 uVar5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if ((((this->allow_extra_args_ == true) && (result->_M_string_length != 0)) &&
      (pcVar2 = (result->_M_dataplus)._M_p, *pcVar2 == '[')) &&
     (pcVar2[result->_M_string_length - 1] == ']')) {
    std::__cxx11::string::pop_back();
    std::__cxx11::string::substr((ulong)&local_60,(ulong)result);
    detail::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_40,(string *)&local_60,',');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_allocated_capacity != &local_50) {
      operator_delete((void *)local_60._M_allocated_capacity,local_50._M_allocated_capacity + 1);
    }
    iVar6 = 0;
    for (uVar5 = local_40._M_allocated_capacity; uVar5 != local_40._8_8_; uVar5 = uVar5 + 0x20) {
      if (((string *)uVar5)->_M_string_length != 0) {
        iVar3 = _add_result(this,(string *)uVar5,res);
        iVar6 = iVar6 + iVar3;
      }
    }
    this_00 = &local_40;
LAB_0012c8f1:
    bwt::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00);
  }
  else {
    cVar1 = (this->super_OptionBase<CLI::Option>).delimiter_;
    if (cVar1 != '\0') {
      iVar6 = 0;
      lVar4 = std::__cxx11::string::find((char)result,(ulong)(uint)(int)cVar1);
      if (lVar4 != -1) {
        detail::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_60,result,(this->super_OptionBase<CLI::Option>).delimiter_);
        if (local_60._M_allocated_capacity != local_60._8_8_) {
          iVar6 = 0;
          uVar5 = local_60._M_allocated_capacity;
          do {
            if (*(long *)(uVar5 + 8) != 0) {
              bwt::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(res,(value_type *)uVar5);
              iVar6 = iVar6 + 1;
            }
            uVar5 = uVar5 + 0x20;
          } while (uVar5 != local_60._8_8_);
        }
        this_00 = &local_60;
        goto LAB_0012c8f1;
      }
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)res,result);
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int _add_result(std::string &&result, std::vector<std::string> &res) const {
        int result_count = 0;
        if(allow_extra_args_ && !result.empty() && result.front() == '[' &&
           result.back() == ']') { // this is now a vector string likely from the default or user entry
            result.pop_back();

            for(auto &var : CLI::detail::split(result.substr(1), ',')) {
                if(!var.empty()) {
                    result_count += _add_result(std::move(var), res);
                }
            }
            return result_count;
        }
        if(delimiter_ == '\0') {
            res.push_back(std::move(result));
            ++result_count;
        } else {
            if((result.find_first_of(delimiter_) != std::string::npos)) {
                for(const auto &var : CLI::detail::split(result, delimiter_)) {
                    if(!var.empty()) {
                        res.push_back(var);
                        ++result_count;
                    }
                }
            } else {
                res.push_back(std::move(result));
                ++result_count;
            }
        }
        return result_count;
    }